

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBox.h
# Opt level: O2

void __thiscall adios2::kvcache::QueryBox::QueryBox(QueryBox *this,size_t dimCount)

{
  size_t *psVar1;
  size_t i;
  size_t sVar2;
  
  psVar1 = (this->Start).Dimensions;
  (this->Start).super_CoreDims.DimCount = dimCount;
  (this->Start).super_CoreDims.DimensSpan = psVar1;
  memset(psVar1,0,0x100);
  psVar1 = (this->Count).Dimensions;
  (this->Count).super_CoreDims.DimCount = dimCount;
  (this->Count).super_CoreDims.DimensSpan = psVar1;
  memset(psVar1,0,0x100);
  for (sVar2 = 0; dimCount != sVar2; sVar2 = sVar2 + 1) {
    (this->Start).Dimensions[sVar2] = 0;
    psVar1[sVar2] = 0;
  }
  return;
}

Assistant:

explicit QueryBox(size_t dimCount) : Start(dimCount), Count(dimCount)
    {
        for (size_t i = 0; i < dimCount; ++i)
        {
            Start[i] = 0;
            Count[i] = 0;
        }
    }